

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

BmsParseInvalidBarChangeValueException * __thiscall
BmsParseInvalidBarChangeValueException::Message_abi_cxx11_
          (BmsParseInvalidBarChangeValueException *this)

{
  ostream *poVar1;
  long in_RSI;
  stringstream local_1a0 [8];
  stringstream os;
  ostream local_190 [384];
  BmsParseInvalidBarChangeValueException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,anon_var_dwarf_2c392);
  std::operator<<(poVar1,(string *)(in_RSI + 0x10));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
BmsParseInvalidBarChangeValueException::Message( void ) const
{
  std::stringstream os;
  os << "小節長変更の値が不正です。不正な文字列 : " << str_;
  return os.str();
}